

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRgbaThreading.cpp
# Opt level: O2

void testRgbaThreading(string *tempDir)

{
  ushort *puVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  Rgba *pRVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  LineOrder in_R9D;
  int iVar9;
  RgbaChannels channels;
  Array2D<Imf_3_2::Rgba> *p1_00;
  float fVar10;
  double dVar11;
  double dVar12;
  Compression in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  long local_68;
  double local_60;
  double local_58;
  double local_50;
  Array2D<Imf_3_2::Rgba> p1;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing setGlobalThreadCount()");
  std::endl<char,std::char_traits<char>>(poVar4);
  cVar2 = IlmThread_3_2::supportsThreads();
  if (cVar2 == '\0') {
    poVar4 = std::operator<<((ostream *)&std::cout,"   Threading not supported!");
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    uVar7 = 0;
    for (iVar9 = 0; iVar9 != -10000; iVar9 = iVar9 + -1) {
      fVar10 = (float)Imath_3_2::Rand32::nextf();
      Imf_3_2::setGlobalThreadCount((int)(fVar10 * 32.0 + 0.5));
      if ((short)((short)((uVar7 & 0xffff) / 2000) * -2000) == (short)iVar9) {
        std::operator<<((ostream *)&std::cout,".");
        std::ostream::flush();
      }
      uVar7 = uVar7 + 1;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"\nok\n");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "Testing multi-threaded writing of scanlines\nin random-sized blocks");
    std::endl<char,std::char_traits<char>>(poVar4);
    p1._sizeX = 0x77;
    p1._sizeY = 0xed;
    pRVar5 = (Rgba *)operator_new__(0x37158);
    lVar6 = 0;
    p1._data = pRVar5;
    while (lVar6 != 0x77) {
      local_50 = (double)(int)lVar6;
      local_58 = local_50 * 0.1;
      local_60 = local_50 * 0.2;
      local_50 = local_50 * 0.3;
      iVar9 = 0;
      local_68 = lVar6;
      for (lVar8 = 0; lVar8 != 0x768; lVar8 = lVar8 + 8) {
        dVar11 = (double)iVar9 * 0.1;
        dVar12 = sin(dVar11 + local_58);
        Imath_3_2::half::operator=
                  ((half *)((long)&(pRVar5->r)._h + lVar8),(float)(dVar12 * 0.5 + 0.5));
        dVar12 = sin(dVar11 + local_60);
        Imath_3_2::half::operator=
                  ((half *)((long)&(pRVar5->g)._h + lVar8),(float)(dVar12 * 0.5 + 0.5));
        dVar11 = sin(dVar11 + local_50);
        puVar1 = (ushort *)((long)&(pRVar5->r)._h + lVar8);
        Imath_3_2::half::operator=((half *)(puVar1 + 2),(float)(dVar11 * 0.5 + 0.5));
        Imath_3_2::half::operator=
                  ((half *)((long)&(pRVar5->a)._h + lVar8),
                   (*(float *)(_imath_half_to_float_table + (ulong)*puVar1 * 4) +
                    *(float *)(_imath_half_to_float_table + (ulong)((half *)(puVar1 + 2))->_h * 4) +
                   *(float *)(_imath_half_to_float_table + (ulong)puVar1[1] * 4)) / 3.0);
        iVar9 = iVar9 + 1;
      }
      pRVar5 = pRVar5 + 0xed;
      lVar6 = local_68 + 1;
    }
    for (iVar9 = 0; iVar9 != 9; iVar9 = iVar9 + 1) {
      Imf_3_2::setGlobalThreadCount(iVar9 * 3 & 7);
      poVar4 = std::operator<<((ostream *)&std::cout,"number of threads: ");
      iVar3 = Imf_3_2::globalThreadCount();
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      std::endl<char,std::char_traits<char>>(poVar4);
      for (channels = 0; channels != (WRITE_A|WRITE_G); channels = channels + WRITE_R) {
        for (p1_00 = (Array2D<Imf_3_2::Rgba> *)0x0; (int)p1_00 != 2;
            p1_00 = (Array2D<Imf_3_2::Rgba> *)(ulong)((int)p1_00 + 1)) {
          std::operator+(&local_88,tempDir,"imf_test_rgba.exr");
          iVar3 = (int)&p1;
          anon_unknown.dwarf_258899::writeReadRGBA
                    (local_88._M_dataplus._M_p,iVar3,0xf,p1_00,channels,in_R9D,
                     in_stack_ffffffffffffff68);
          std::__cxx11::string::~string((string *)&local_88);
          std::operator+(&local_88,tempDir,"imf_test_rgba.exr");
          anon_unknown.dwarf_258899::writeReadRGBA
                    (local_88._M_dataplus._M_p,iVar3,7,p1_00,channels,in_R9D,
                     in_stack_ffffffffffffff68);
          std::__cxx11::string::~string((string *)&local_88);
          std::operator+(&local_88,tempDir,"imf_test_rgba.exr");
          anon_unknown.dwarf_258899::writeReadRGBA
                    (local_88._M_dataplus._M_p,iVar3,8,p1_00,channels,in_R9D,
                     in_stack_ffffffffffffff68);
          std::__cxx11::string::~string((string *)&local_88);
          std::operator+(&local_88,tempDir,"imf_test_rgba.exr");
          anon_unknown.dwarf_258899::writeReadRGBA
                    (local_88._M_dataplus._M_p,iVar3,5,p1_00,channels,in_R9D,
                     in_stack_ffffffffffffff68);
          std::__cxx11::string::~string((string *)&local_88);
        }
      }
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"ok\n");
    std::endl<char,std::char_traits<char>>(poVar4);
    Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(&p1);
  }
  return;
}

Assistant:

void
testRgbaThreading (const std::string& tempDir)
{
    try
    {
        cout << "Testing setGlobalThreadCount()" << endl;

        if (!ILMTHREAD_NAMESPACE::supportsThreads ())
        {
            cout << "   Threading not supported!" << endl << endl;
            return;
        }

        for (int i = 0; i < 10000; i++)
        {
            int numThreads = int (rand1.nextf () * 32 + 0.5f);
            setGlobalThreadCount (numThreads);

            if (i % 2000 == 0) cout << "." << flush;
        }

        cout << "\nok\n" << endl;

        cout << "Testing multi-threaded writing of scanlines\n"
                "in random-sized blocks"
             << endl;

        const int W = 237;
        const int H = 119;

        Array2D<Rgba> p1 (H, W);
        fillPixels (p1, W, H);

        for (int n = 0; n <= 8; n++)
        {
            int numThreads = (n * 3) % 8;

            setGlobalThreadCount (numThreads);
            cout << "number of threads: " << globalThreadCount () << endl;

            for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
            {
                for (int lorder = 0; lorder < RANDOM_Y; ++lorder)
                {
                    writeReadRGBA (
                        (tempDir + "imf_test_rgba.exr").c_str (),
                        W,
                        H,
                        p1,
                        WRITE_RGBA,
                        LineOrder (lorder),
                        Compression (comp));

                    writeReadRGBA (
                        (tempDir + "imf_test_rgba.exr").c_str (),
                        W,
                        H,
                        p1,
                        WRITE_RGB,
                        LineOrder (lorder),
                        Compression (comp));

                    writeReadRGBA (
                        (tempDir + "imf_test_rgba.exr").c_str (),
                        W,
                        H,
                        p1,
                        WRITE_A,
                        LineOrder (lorder),
                        Compression (comp));

                    writeReadRGBA (
                        (tempDir + "imf_test_rgba.exr").c_str (),
                        W,
                        H,
                        p1,
                        RgbaChannels (WRITE_R | WRITE_B),
                        LineOrder (lorder),
                        Compression (comp));
                }
            }
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}